

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

CharConv * CharConv::conv_for_type(CVmPackType *t)

{
  wchar_t wVar1;
  CharConvLatin1 *pCVar2;
  CharConvUCS2B *pCVar3;
  
  wVar1 = t->type_code;
  pCVar2 = &s_CharConvLatin1;
  if (wVar1 == L'A') {
    return &s_CharConvLatin1.super_CharConv;
  }
  if (wVar1 == L'H') {
    return (CharConv *)&s_CharConvHexB;
  }
  if (wVar1 == L'U') {
    return &s_CharConvUTF8.super_CharConv;
  }
  if (wVar1 == L'W') {
LAB_00269692:
    pCVar3 = &s_CharConvUCS2B;
    if (t->big_endian == 0) {
      pCVar3 = (CharConvUCS2B *)&s_CharConvUCS2L;
    }
    return (CharConv *)pCVar3;
  }
  if (wVar1 != L'a') {
    if (wVar1 == L'w') goto LAB_00269692;
    if (wVar1 == L'h') {
      return (CharConv *)&s_CharConvHexL;
    }
    if (wVar1 == L'u') {
      return &s_CharConvUTF8.super_CharConv;
    }
    if (wVar1 == L'b') {
      return &s_CharConvByte.super_CharConv;
    }
    pCVar2 = (CharConvLatin1 *)0x0;
  }
  return &pCVar2->super_CharConv;
}

Assistant:

CharConv *CharConv::conv_for_type(const CVmPackType *t)
{
    switch (t->type_code)
    {
    case 'a':
    case 'A':
        return &s_CharConvLatin1;

    case 'b':
        return &s_CharConvByte;

    case 'u':
    case 'U':
        return &s_CharConvUTF8;

    case 'w':
    case 'W':
        if (t->big_endian)
            return &s_CharConvUCS2B;
        else
            return &s_CharConvUCS2L;

    case 'h':
        return &s_CharConvHexL;

    case 'H':
        return &s_CharConvHexB;

    default:
        /* it's not a string type */
        return 0;
    }
}